

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O3

JsErrorCode
JsDiagSetBreakpoint(uint scriptId,uint lineNumber,uint columnNumber,JsValueRef *breakpoint)

{
  ScriptContext *scriptContext;
  JsrtRuntime *this;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  Utf8SourceInfo *pUVar2;
  bool bVar3;
  JsErrorCode JVar4;
  int iVar5;
  JsrtContext *pJVar6;
  JsrtDebugManager *pJVar7;
  List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
  *pLVar8;
  DynamicObject *pDVar9;
  long lVar10;
  long lVar11;
  ScriptContext *pSVar12;
  Utf8SourceInfo *utf8SourceInfo;
  void *unaff_retaddr;
  undefined1 auStack_d8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_98 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_3c;
  ScriptContext *pSStack_38;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar6 = JsrtContext::GetCurrent();
  JVar4 = CheckContext(pJVar6,false,false);
  if (JVar4 == JsNoError) {
    scriptContext =
         (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (&local_3c,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_d8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_98,scriptContext,(ScriptEntryExitRecord *)auStack_d8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_98);
    if (breakpoint == (JsValueRef *)0x0) {
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_98);
      JVar4 = JsErrorNullArgument;
    }
    else {
      *breakpoint = (JsValueRef)0x0;
      pJVar6 = JsrtContext::GetCurrent();
      this = (pJVar6->runtime).ptr;
      ThreadContextScope::ThreadContextScope
                ((ThreadContextScope *)&__enterScriptObject.library,this->threadContext);
      JVar4 = JsErrorWrongThread;
      if (__enterScriptObject.library._1_1_ == '\x01') {
        pJVar7 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar4 = JsErrorDiagNotInDebugMode;
        if (pJVar7 != (JsrtDebugManager *)0x0) {
          pJVar7 = JsrtRuntime::GetJsrtDebugManager(this);
          bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(pJVar7);
          if (bVar3) {
            pSVar12 = this->threadContext->scriptContextList;
            JVar4 = JsErrorDiagObjectNotFound;
            pSStack_38 = scriptContext;
            if (pSVar12 != (ScriptContext *)0x0) {
              do {
                iVar5 = (*(pSVar12->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar12)
                ;
                if ((char)iVar5 != '\0') goto LAB_003b1486;
                pLVar8 = Memory::
                         RecyclerRootPtr<JsUtil::List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>_>
                         ::operator->(&pSVar12->sourceList);
                lVar10 = (long)(pLVar8->
                               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                               ).count;
                if (lVar10 < 1) {
                  utf8SourceInfo = (Utf8SourceInfo *)0x0;
                }
                else {
                  utf8SourceInfo = (Utf8SourceInfo *)0x0;
                  lVar11 = 0;
                  do {
                    pRVar1 = (pLVar8->
                             super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
                             ).buffer.ptr[lVar11].ptr;
                    if (((((ulong)pRVar1 & 1) == 0 &&
                          pRVar1 != (RecyclerWeakReference<Js::Utf8SourceInfo> *)0x0) &&
                        (pUVar2 = (Utf8SourceInfo *)
                                  (pRVar1->super_RecyclerWeakReferenceBase).strongRef,
                        pUVar2 != (Utf8SourceInfo *)0x0)) && (pUVar2->m_sourceInfoId == scriptId)) {
                      utf8SourceInfo = pUVar2;
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar10 != lVar11);
                }
                pSVar12 = pSVar12->next;
              } while ((pSVar12 != (ScriptContext *)0x0) &&
                      (utf8SourceInfo == (Utf8SourceInfo *)0x0));
              if ((utf8SourceInfo != (Utf8SourceInfo *)0x0) &&
                 ((utf8SourceInfo->m_debugDocument).ptr != (DebugDocument *)0x0)) {
                pJVar7 = JsrtRuntime::GetJsrtDebugManager(this);
                pDVar9 = JsrtDebugManager::SetBreakPoint
                                   (pJVar7,(((pJVar6->javascriptLibrary).ptr)->
                                           super_JavascriptLibraryBase).scriptContext.ptr,
                                    utf8SourceInfo,lineNumber,columnNumber);
                if (pDVar9 == (DynamicObject *)0x0) {
                  JVar4 = JsErrorDiagUnableToPerformAction;
                }
                else {
                  *breakpoint = pDVar9;
                  JVar4 = JsNoError;
                }
              }
            }
          }
        }
      }
LAB_003b1486:
      ThreadContextScope::~ThreadContextScope((ThreadContextScope *)&__enterScriptObject.library);
      Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_98);
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(&local_3c);
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsDiagSetBreakpoint(
    _In_ unsigned int scriptId,
    _In_ unsigned int lineNumber,
    _In_ unsigned int columnNumber,
    _Out_ JsValueRef *breakpoint)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        PARAM_NOT_NULL(breakpoint);
        *breakpoint = JS_INVALID_REFERENCE;

        JsrtContext* currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        ThreadContextScope scope(runtime->GetThreadContext());

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        VALIDATE_IS_DEBUGGING(runtime->GetJsrtDebugManager());

        Js::Utf8SourceInfo* utf8SourceInfo = nullptr;

        for (Js::ScriptContext* currentScriptContext = runtime->GetThreadContext()->GetScriptContextList();
            currentScriptContext != nullptr && utf8SourceInfo == nullptr && !currentScriptContext->IsClosed();
            currentScriptContext = currentScriptContext->next)
        {
            currentScriptContext->MapScript([&](Js::Utf8SourceInfo* sourceInfo) -> bool
            {
                if (sourceInfo->GetSourceInfoId() == scriptId)
                {
                    utf8SourceInfo = sourceInfo;
                    return true;
                }
                return false;
            });
        }

        if (utf8SourceInfo != nullptr && utf8SourceInfo->HasDebugDocument())
        {
            JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();
            Js::DynamicObject* bpObject = jsrtDebugManager->SetBreakPoint(currentContext->GetScriptContext(), utf8SourceInfo, lineNumber, columnNumber);

            if(bpObject != nullptr)
            {
                *breakpoint = bpObject;
                return JsNoError;
            }

            return JsErrorDiagUnableToPerformAction;
        }

        return JsErrorDiagObjectNotFound;
    });
#endif
}